

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

OneWayPipe * __thiscall
kj::anon_unknown_0::AsyncIoProviderImpl::newOneWayPipe
          (OneWayPipe *__return_storage_ptr__,AsyncIoProviderImpl *this)

{
  int iVar1;
  int fds [2];
  Fault f;
  ulong local_48;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_48 = 0;
  do {
    iVar1 = pipe2((int *)&local_48,0x80800);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    (**this->lowLevel->_vptr_LowLevelAsyncIoProvider)
              (__return_storage_ptr__,this->lowLevel,local_48 & 0xffffffff,7);
    (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[1])
              (&__return_storage_ptr__->out,this->lowLevel,local_48 >> 0x20,7);
    return __return_storage_ptr__;
  }
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  kj::_::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

OneWayPipe newOneWayPipe() override {
    int fds[2]{};
#if __linux__ && !__BIONIC__
    KJ_SYSCALL(pipe2(fds, O_NONBLOCK | O_CLOEXEC));
#else
    KJ_SYSCALL(pipe(fds));
#endif
    return OneWayPipe {
      lowLevel.wrapInputFd(fds[0], NEW_FD_FLAGS),
      lowLevel.wrapOutputFd(fds[1], NEW_FD_FLAGS)
    };
  }